

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

ImageFeatureType_ImageSizeRange * __thiscall
CoreML::Specification::ImageFeatureType::mutable_imagesizerange(ImageFeatureType *this)

{
  ImageFeatureType_EnumeratedImageSizes *this_00;
  
  if (this->_oneof_case_[0] == 0x1f) {
    this_00 = (this->SizeFlexibility_).enumeratedsizes_;
  }
  else {
    clear_SizeFlexibility(this);
    this->_oneof_case_[0] = 0x1f;
    this_00 = (ImageFeatureType_EnumeratedImageSizes *)operator_new(0x28);
    ImageFeatureType_ImageSizeRange::ImageFeatureType_ImageSizeRange
              ((ImageFeatureType_ImageSizeRange *)this_00);
    (this->SizeFlexibility_).imagesizerange_ = (ImageFeatureType_ImageSizeRange *)this_00;
  }
  return (ImageFeatureType_ImageSizeRange *)this_00;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType_ImageSizeRange* ImageFeatureType::mutable_imagesizerange() {
  if (!has_imagesizerange()) {
    clear_SizeFlexibility();
    set_has_imagesizerange();
    SizeFlexibility_.imagesizerange_ = new ::CoreML::Specification::ImageFeatureType_ImageSizeRange;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.imageSizeRange)
  return SizeFlexibility_.imagesizerange_;
}